

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

bool vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::comparePrimitivesExact
               (PerPrimitive *primitivesA,PerPrimitive *primitivesB,int numPrimitivesPerPatch)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Vec4 (*coordsB) [3];
  int i;
  bool match;
  Vec4 (*coordsA) [3];
  int local_28;
  int ndxA;
  int ndxB;
  int numPrimitivesPerPatch_local;
  PerPrimitive *primitivesB_local;
  PerPrimitive *primitivesA_local;
  
  local_28 = 0;
  coordsA._4_4_ = 0;
  do {
    if (numPrimitivesPerPatch <= coordsA._4_4_) {
      return true;
    }
    bVar1 = false;
    for (coordsB._0_4_ = 0; (int)coordsB < numPrimitivesPerPatch; coordsB._0_4_ = (int)coordsB + 1)
    {
      iVar3 = (local_28 + 1) % numPrimitivesPerPatch;
      bVar2 = tcu::Vector<float,_4>::operator==
                        (primitivesA[coordsA._4_4_].tessCoord,primitivesB[local_28].tessCoord);
      if (((bVar2) &&
          (bVar2 = tcu::Vector<float,_4>::operator==
                             (primitivesA[coordsA._4_4_].tessCoord + 1,
                              primitivesB[local_28].tessCoord + 1), bVar2)) &&
         (bVar2 = tcu::Vector<float,_4>::operator==
                            (primitivesA[coordsA._4_4_].tessCoord + 2,
                             primitivesB[local_28].tessCoord + 2), bVar2)) {
        bVar1 = true;
        local_28 = iVar3;
        break;
      }
      local_28 = iVar3;
    }
    if (!bVar1) {
      return false;
    }
    coordsA._4_4_ = coordsA._4_4_ + 1;
  } while( true );
}

Assistant:

bool comparePrimitivesExact (const PerPrimitive* const primitivesA, const PerPrimitive* const primitivesB, const int numPrimitivesPerPatch)
{
	int ndxB = 0;
	for (int ndxA = 0; ndxA < numPrimitivesPerPatch; ++ndxA)
	{
		const tcu::Vec4 (&coordsA)[3] = primitivesA[ndxA].tessCoord;
		bool match = false;

		// Actually both sets are usually somewhat sorted, so don't reset ndxB after each match. Instead, continue from the next index.
		for (int i = 0; i < numPrimitivesPerPatch; ++i)
		{
			const tcu::Vec4 (&coordsB)[3] = primitivesB[ndxB].tessCoord;
			ndxB = (ndxB + 1) % numPrimitivesPerPatch;

			if (coordsA[0] == coordsB[0] && coordsA[1] == coordsB[1] && coordsA[2] == coordsB[2])
			{
				match = true;
				break;
			}
		}

		if (!match)
			return false;
	}
	return true;
}